

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgssv.c
# Opt level: O0

void dgssv(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *perm_r,SuperMatrix *L,
          SuperMatrix *U,SuperMatrix *B,SuperLUStat_t *stat,int_t *info)

{
  int *etree_00;
  double dVar1;
  int local_15c;
  int local_154;
  int_t *piStack_150;
  int info1;
  NRformat *Astore;
  double t;
  double *utime;
  trans_t trans;
  int permc_spec;
  int relax;
  int panel_size;
  GlobalLU_t Glu;
  int i;
  int *etree;
  undefined1 local_90 [4];
  int lwork;
  SuperMatrix AC;
  SuperMatrix *AA;
  DNformat *Bstore;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  int *perm_r_local;
  int *perm_c_local;
  SuperMatrix *A_local;
  superlu_options_t *options_local;
  
  utime._0_4_ = NOTRANS;
  *info = 0;
  if (options->Fact == DOFACT) {
    if ((((A->nrow == A->ncol) && (-1 < A->nrow)) && ((A->Stype == SLU_NC || (A->Stype == SLU_NR))))
       && ((A->Dtype == SLU_D && (A->Mtype == SLU_GE)))) {
      if (-1 < B->ncol) {
        if (A->nrow < 0) {
          local_15c = 0;
        }
        else {
          local_15c = A->nrow;
        }
        if ((((local_15c <= *B->Store) && (B->Stype == SLU_DN)) && (B->Dtype == SLU_D)) &&
           (B->Mtype == SLU_GE)) goto LAB_00103159;
      }
      *info = -7;
    }
    else {
      *info = -2;
    }
  }
  else {
    *info = -1;
  }
LAB_00103159:
  if (*info == 0) {
    t = (double)stat->utime;
    if (A->Stype == SLU_NR) {
      piStack_150 = (int_t *)A->Store;
      AC.Store = superlu_malloc(0x20);
      dCreate_CompCol_Matrix
                ((SuperMatrix *)AC.Store,A->ncol,A->nrow,*piStack_150,*(double **)(piStack_150 + 2),
                 *(int_t **)(piStack_150 + 4),*(int_t **)(piStack_150 + 6),SLU_NC,A->Dtype,A->Mtype)
      ;
      utime._0_4_ = TRANS;
    }
    else {
      AC.Store = A;
      if (A->Stype != SLU_NC) {
        AC.Store = (void *)0x0;
        *info = 1;
        input_error("dgssv",(int *)((long)&Glu.stack.array + 4));
      }
    }
    Astore = (NRformat *)SuperLU_timer_();
    utime._4_4_ = options->ColPerm;
    if ((utime._4_4_ != MY_PERMC) && (options->Fact == DOFACT)) {
      get_perm_c(utime._4_4_,(SuperMatrix *)AC.Store,perm_c);
    }
    dVar1 = SuperLU_timer_();
    *(double *)t = dVar1 - (double)Astore;
    etree_00 = int32Malloc(A->ncol);
    Astore = (NRformat *)SuperLU_timer_();
    sp_preorder(options,(SuperMatrix *)AC.Store,perm_c,etree_00,(SuperMatrix *)local_90);
    dVar1 = SuperLU_timer_();
    *(double *)((long)t + 0x18) = dVar1 - (double)Astore;
    permc_spec = sp_ienv(1);
    trans = sp_ienv(2);
    Astore = (NRformat *)SuperLU_timer_();
    dgstrf(options,(SuperMatrix *)local_90,trans,permc_spec,etree_00,(void *)0x0,0,perm_c,perm_r,L,U
           ,(GlobalLU_t *)&relax,stat,info);
    dVar1 = SuperLU_timer_();
    *(double *)((long)t + 0x38) = dVar1 - (double)Astore;
    Astore = (NRformat *)SuperLU_timer_();
    if (*info == 0) {
      dgstrs((trans_t)utime,L,U,perm_c,perm_r,B,stat,&local_154);
    }
    dVar1 = SuperLU_timer_();
    *(double *)((long)t + 0x88) = dVar1 - (double)Astore;
    superlu_free(etree_00);
    Destroy_CompCol_Permuted((SuperMatrix *)local_90);
    if (A->Stype == SLU_NR) {
      Destroy_SuperMatrix_Store((SuperMatrix *)AC.Store);
      superlu_free(AC.Store);
    }
  }
  else {
    Glu.stack.array._4_4_ = -*info;
    input_error("dgssv",(int *)((long)&Glu.stack.array + 4));
  }
  return;
}

Assistant:

void
dgssv(superlu_options_t *options, SuperMatrix *A, int *perm_c, int *perm_r,
      SuperMatrix *L, SuperMatrix *U, SuperMatrix *B,
      SuperLUStat_t *stat, int_t *info )
{

    DNformat *Bstore;
    SuperMatrix *AA;/* A in SLU_NC format used by the factorization routine.*/
    SuperMatrix AC; /* Matrix postmultiplied by Pc */
    int      lwork = 0, *etree, i;
    GlobalLU_t Glu; /* Not needed on return. */
    
    /* Set default values for some parameters */
    int      panel_size;     /* panel size */
    int      relax;          /* no of columns in a relaxed snodes */
    int      permc_spec;
    trans_t  trans = NOTRANS;
    double   *utime;
    double   t;	/* Temporary time */

    /* Test the input parameters ... */
    *info = 0;
    Bstore = B->Store;
    if ( options->Fact != DOFACT ) *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	 (A->Stype != SLU_NC && A->Stype != SLU_NR) ||
	 A->Dtype != SLU_D || A->Mtype != SLU_GE )
	*info = -2;
    else if ( B->ncol < 0 || Bstore->lda < SUPERLU_MAX(0, A->nrow) ||
	B->Stype != SLU_DN || B->Dtype != SLU_D || B->Mtype != SLU_GE )
	*info = -7;
    if ( *info != 0 ) {
	i = -(*info);
	input_error("dgssv", &i);
	return;
    }

    utime = stat->utime;

    /* Convert A to SLU_NC format when necessary. */
    if ( A->Stype == SLU_NR ) {
	NRformat *Astore = A->Store;
	AA = (SuperMatrix *) SUPERLU_MALLOC( sizeof(SuperMatrix) );
	dCreate_CompCol_Matrix(AA, A->ncol, A->nrow, Astore->nnz, 
			       Astore->nzval, Astore->colind, Astore->rowptr,
			       SLU_NC, A->Dtype, A->Mtype);
	trans = TRANS;
    } else if ( A->Stype == SLU_NC ) {
        AA = A;
    }
    /* A is of unsupported matrix format. */
    else {
        AA = NULL;
        *info = 1;
        input_error("dgssv", &i);
    }

    t = SuperLU_timer_();
    /*
     * Get column permutation vector perm_c[], according to permc_spec:
     *   permc_spec = NATURAL:  natural ordering 
     *   permc_spec = MMD_AT_PLUS_A: minimum degree on structure of A'+A
     *   permc_spec = MMD_ATA:  minimum degree on structure of A'*A
     *   permc_spec = COLAMD:   approximate minimum degree column ordering
     *   permc_spec = MY_PERMC: the ordering already supplied in perm_c[]
     */
    permc_spec = options->ColPerm;
    if ( permc_spec != MY_PERMC && options->Fact == DOFACT )
      get_perm_c(permc_spec, AA, perm_c);
    utime[COLPERM] = SuperLU_timer_() - t;

    etree = int32Malloc(A->ncol);

    t = SuperLU_timer_();
    sp_preorder(options, AA, perm_c, etree, &AC);
    utime[ETREE] = SuperLU_timer_() - t;

    panel_size = sp_ienv(1);
    relax = sp_ienv(2);

    /*printf("Factor PA = LU ... relax %d\tw %d\tmaxsuper %d\trowblk %d\n", 
	  relax, panel_size, sp_ienv(3), sp_ienv(4));*/
    t = SuperLU_timer_(); 
    /* Compute the LU factorization of A. */
    dgstrf(options, &AC, relax, panel_size, etree,
            NULL, lwork, perm_c, perm_r, L, U, &Glu, stat, info);
    utime[FACT] = SuperLU_timer_() - t;

    t = SuperLU_timer_();
    if ( *info == 0 ) {
        /* Solve the system A*X=B, overwriting B with X. */
	int info1;
        dgstrs (trans, L, U, perm_c, perm_r, B, stat, &info1);
    }
#if ( PRNTlevel>=1 )
     else {
        printf("dgstrf info %lld\n", (long long) *info); fflush(stdout);
    }
#endif
    
    utime[SOLVE] = SuperLU_timer_() - t;

    SUPERLU_FREE (etree);
    Destroy_CompCol_Permuted(&AC);
    if ( A->Stype == SLU_NR ) {
	Destroy_SuperMatrix_Store(AA);
	SUPERLU_FREE(AA);
    }

}